

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::SplitterBehavior
               (ImGuiID id,ImRect *bb,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  undefined1 auVar3 [12];
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiAxis IVar7;
  bool bVar8;
  ImU32 col;
  ImGuiCol idx;
  undefined1 uVar9;
  float fVar10;
  float fVar12;
  undefined1 auVar11 [16];
  float fVar13;
  bool held;
  bool hovered;
  float local_94;
  float local_90;
  ImGuiAxis local_8c;
  ImVec2 local_88;
  ImVec2 IStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float *local_60;
  float *local_58;
  ImGuiWindow *local_50;
  ImRect local_48;
  
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  uVar1 = (pIVar2->DC).ItemFlags;
  (pIVar2->DC).ItemFlags = uVar1 | 0x18;
  local_94 = min_size2;
  local_90 = min_size1;
  local_8c = axis;
  local_78 = hover_extend;
  local_60 = size1;
  local_58 = size2;
  bVar8 = ItemAdd(bb,id,(ImRect *)0x0);
  IVar7 = local_8c;
  (pIVar2->DC).ItemFlags = uVar1;
  uVar9 = 0;
  if (bVar8) {
    IVar4 = bb->Max;
    fVar13 = (float)((uint)local_78 & (int)((uint)(local_8c == ImGuiAxis_Y) << 0x1f) >> 0x1f);
    fVar10 = (float)(~((int)((uint)(local_8c == ImGuiAxis_Y) << 0x1f) >> 0x1f) & (uint)local_78);
    fVar12 = (bb->Min).y;
    local_78 = (bb->Min).x - fVar10;
    fStack_74 = fVar12 - fVar13;
    fStack_70 = IVar4.x - fVar10;
    fStack_6c = IVar4.y - fVar13;
    auVar3._4_4_ = IVar4.x;
    auVar3._8_4_ = IVar4.y;
    auVar3._0_4_ = fVar12 + fVar13;
    auVar11._0_8_ = auVar3._0_8_ << 0x20;
    auVar11._8_4_ = IVar4.x + fVar10;
    auVar11._12_4_ = IVar4.y + fVar13;
    local_48.Max = auVar11._8_8_;
    local_48.Min.y = fStack_74;
    local_48.Min.x = local_78;
    local_50 = pIVar2;
    ButtonBehavior(&local_48,id,&hovered,&held,0x60);
    if (pIVar6->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if (held == false) {
      if ((pIVar6->HoveredId == id) && (pIVar6->HoveredIdPreviousFrame == id)) {
        GImGui->MouseCursor = (IVar7 != ImGuiAxis_Y) + 3;
      }
      local_88.x = (bb->Min).x;
      local_88.y = (bb->Min).y;
      IStack_80.x = (bb->Max).x;
      IStack_80.y = (bb->Max).y;
    }
    else {
      GImGui->MouseCursor = (IVar7 != ImGuiAxis_Y) + 3;
      IVar4 = bb->Min;
      IVar5 = bb->Max;
      if (IVar7 == ImGuiAxis_Y) {
        fVar10 = ((pIVar6->IO).MousePos.y - (pIVar6->ActiveIdClickOffset).y) - fStack_74;
      }
      else {
        fVar10 = ((pIVar6->IO).MousePos.x - (pIVar6->ActiveIdClickOffset).x) - local_78;
      }
      fVar12 = local_90 - *local_60;
      if (fVar12 <= fVar10) {
        fVar12 = fVar10;
      }
      fVar10 = *local_58 - local_94;
      if (fVar12 <= *local_58 - local_94) {
        fVar10 = fVar12;
      }
      *local_60 = *local_60 + fVar10;
      *local_58 = *local_58 - fVar10;
      fVar12 = (float)((uint)fVar10 & (int)((uint)(IVar7 == ImGuiAxis_X) << 0x1f) >> 0x1f);
      fVar10 = (float)(~((int)((uint)(IVar7 == ImGuiAxis_X) << 0x1f) >> 0x1f) & (uint)fVar10);
      local_88.x = IVar4.x;
      local_88.y = IVar4.y;
      IStack_80.x = IVar5.x;
      IStack_80.y = IVar5.y;
      local_88.x = fVar12 + local_88.x;
      local_88.y = fVar10 + local_88.y;
      IStack_80.x = fVar12 + IStack_80.x;
      IStack_80.y = fVar10 + IStack_80.y;
    }
    idx = 0x1d;
    if (held == false) {
      idx = (hovered & 1) + 0x1b;
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled
              (local_50->DrawList,&local_88,&IStack_80,col,(pIVar6->Style).FrameRounding,0xf);
    uVar9 = held;
  }
  return (bool)uVar9;
}

Assistant:

bool ImGui::SplitterBehavior(ImGuiID id, const ImRect& bb, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        if (mouse_delta < min_size1 - *size1)
            mouse_delta = min_size1 - *size1;
        if (mouse_delta > *size2 - min_size2)
            mouse_delta = *size2 - min_size2;

        // Apply resize
        *size1 += mouse_delta;
        *size2 -= mouse_delta;
        bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, g.Style.FrameRounding);

    return held;
}